

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

void merge_cache_lcp_2way<false,unsigned_char>
               (uchar **from0,lcp_t *lcp_input0,uchar *cache_input0,size_t n0,uchar **from1,
               lcp_t *lcp_input1,uchar *cache_input1,size_t n1,uchar **result,lcp_t *lcp_result,
               uchar *cache_result)

{
  char *__s;
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  size_t sVar5;
  lcp_t lVar6;
  uchar **ppuVar7;
  byte bVar8;
  uchar **ppuVar9;
  uchar uVar10;
  byte c;
  long lVar11;
  uchar *puVar12;
  tuple<int,_unsigned_long> tVar13;
  size_t sVar14;
  uchar **ppuVar15;
  lcp_t *plVar16;
  ulong uVar17;
  undefined8 uVar18;
  lcp_t lVar19;
  lcp_t lVar20;
  lcp_t lVar21;
  size_t sVar22;
  byte *local_90;
  byte *local_80;
  uchar **local_78;
  string local_70;
  string local_50;
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"merge_cache_lcp_2way",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(): n0=",7);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", n1=",5);
  ppuVar7 = from0;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_70,1);
  check_input<unsigned_char>(from0,lcp_input0,cache_input0,n0);
  check_input<unsigned_char>(from1,lcp_input1,cache_input1,n1);
  local_90 = cache_input0 + 1;
  c = *cache_input0;
  local_80 = cache_input1 + 1;
  bVar8 = *cache_input1;
  uVar17 = (ulong)bVar8;
  local_78 = from1;
  if (c < bVar8) {
    puVar12 = *from0;
    if (puVar12 == (uchar *)0x0) {
LAB_00244056:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    if (*from1 == (uchar *)0x0) {
LAB_00244075:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar2 = strcmp((char *)puVar12,(char *)*from1);
    if (-1 < iVar2) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                   );
    }
    *result = puVar12;
    ppuVar7 = result + 1;
    lVar19 = 0;
    if (n0 - 1 != 0) {
      from0 = from0 + 1;
      lVar21 = *lcp_input0;
      lcp_input0 = lcp_input0 + 1;
      c = cache_input0[1];
      local_90 = cache_input0 + 2;
      sVar14 = n0 - 1;
LAB_0024375d:
      ppuVar7 = result + 1;
LAB_00243774:
      lVar11 = 0;
      ppuVar9 = from1;
      plVar16 = lcp_input1;
      local_78 = from1;
      do {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Starting loop, n0=",0x12);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", n1=",5);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ...\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tprev   = \'",0xb);
        puVar12 = ppuVar7[-1];
        iVar2 = (int)poVar4;
        if (puVar12 == (uchar *)0x0) {
          std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
          ppuVar15 = from0;
          lVar20 = lVar19;
          lVar6 = lVar21;
          sVar22 = n1;
        }
        else {
          sVar5 = strlen((char *)puVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)puVar12,sVar5);
          ppuVar15 = from0;
          lVar20 = lVar19;
          lVar6 = lVar21;
          sVar22 = n1;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t*from0 = \'",0xb);
        puVar12 = *ppuVar15;
        if (puVar12 == (uchar *)0x0) {
          std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen((char *)puVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)puVar12,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t*from1 = \'",0xb);
        __s = *(char **)((long)ppuVar9 + lVar11);
        if (__s == (char *)0x0) {
          std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tlcp0   = ",10);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tlcp1   = ",10);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tcache0 = \'",0xb);
        to_str_abi_cxx11_(&local_70,c);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                                    local_70._M_dataplus._M_p._0_1_),
                            CONCAT44(local_70._M_string_length._4_4_,(int)local_70._M_string_length)
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tcache1 = \'",0xb);
        bVar8 = (byte)uVar17;
        to_str_abi_cxx11_(&local_50,bVar8);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
            &local_70.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_))
          ;
        }
        lVar19 = lVar20;
        lVar21 = lVar6;
        check_lcp_and_cache<unsigned_char>
                  (ppuVar7[-1],*ppuVar15,lVar6,c,*(uchar **)((long)ppuVar9 + lVar11),lVar20,bVar8);
        if (lVar20 < lVar6) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tlcp0 > lcp1\n",0xd);
          puVar12 = *ppuVar15;
          if (puVar12 == (uchar *)0x0) goto LAB_00244056;
          if (*(char **)((long)ppuVar9 + lVar11) == (char *)0x0) goto LAB_00244075;
          iVar2 = strcmp((char *)puVar12,*(char **)((long)ppuVar9 + lVar11));
          n1 = sVar22;
          if (-1 < iVar2) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4ae,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                         );
          }
LAB_00243ccf:
          from1 = (uchar **)((long)ppuVar9 + lVar11);
          lcp_input1 = (lcp_t *)((long)plVar16 + lVar11);
          from0 = ppuVar15 + 1;
          *ppuVar7 = puVar12;
          ppuVar7 = ppuVar7 + 1;
          lVar21 = *lcp_input0;
          lcp_input0 = lcp_input0 + 1;
          c = *local_90;
          local_90 = local_90 + 1;
          sVar14 = sVar14 - 1;
          if (sVar14 != 0) goto LAB_00243774;
          goto LAB_00243f81;
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        if (lVar6 < lVar20) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tlcp0 < lcp1\n",0xd);
          if (*ppuVar15 == (uchar *)0x0) goto LAB_00244056;
          puVar12 = *(uchar **)((long)ppuVar9 + lVar11);
          if (puVar12 == (uchar *)0x0) goto LAB_00244075;
          iVar2 = strcmp((char *)*ppuVar15,(char *)puVar12);
          from0 = ppuVar15;
          if (iVar2 < 1) {
            __assert_fail("cmp(*from0, *from1) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4b7,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                         );
          }
        }
        else {
          n1 = sVar22;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tlcp0 == lcp1\n",0xe);
          if (c < bVar8) {
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tcache0 < cache1\n",0x12);
            puVar12 = *ppuVar15;
            if (puVar12 == (uchar *)0x0) goto LAB_00244056;
            if (*(char **)((long)ppuVar9 + lVar11) != (char *)0x0) {
              iVar2 = strcmp((char *)puVar12,*(char **)((long)ppuVar9 + lVar11));
              if (-1 < iVar2) {
                __assert_fail("cmp(*from0, *from1) < 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4c6,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                             );
              }
              goto LAB_00243ccf;
            }
            goto LAB_00244075;
          }
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          if (c <= bVar8) goto LAB_00243d1f;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tcache0 > cache1\n",0x12);
          if (*ppuVar15 == (uchar *)0x0) goto LAB_00244056;
          puVar12 = *(uchar **)((long)ppuVar9 + lVar11);
          if (puVar12 == (uchar *)0x0) goto LAB_00244075;
          iVar2 = strcmp((char *)*ppuVar15,(char *)puVar12);
          from0 = ppuVar15;
          if (iVar2 < 1) {
            __assert_fail("cmp(*from0, *from1) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4d6,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                         );
          }
        }
        *ppuVar7 = puVar12;
        ppuVar7 = ppuVar7 + 1;
        n1 = sVar22 - 1;
        if (n1 == 0) {
          n1 = 0;
          n0 = sVar14;
          goto LAB_00243f5b;
        }
        uVar17 = (ulong)*local_80;
        lVar19 = *(lcp_t *)((long)plVar16 + lVar11);
        local_80 = local_80 + 1;
        local_78 = local_78 + 1;
        lVar11 = lVar11 + 8;
      } while( true );
    }
    sVar14 = 0;
    n1 = n1;
LAB_00243f8f:
    n0 = n1;
    if (sVar14 != 0) {
      __assert_fail("n0==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51d,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                   );
    }
    if (n0 == 0) {
      __assert_fail("n1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51e,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                   );
    }
LAB_00243fb3:
    memmove(ppuVar7,local_78,n0 << 3);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    local_70._M_dataplus._M_p._0_1_ = 0x7e;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_70,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"merge_cache_lcp_2way",0x14);
    local_70._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_70,1);
    return;
  }
  if (bVar8 < c) {
    if (*from0 == (uchar *)0x0) goto LAB_00244056;
    puVar12 = *from1;
    if (puVar12 == (uchar *)0x0) goto LAB_00244075;
    iVar2 = strcmp((char *)*from0,(char *)puVar12);
    if (iVar2 < 1) {
      __assert_fail("cmp(*from0, *from1) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x45c,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                   );
    }
    *result = puVar12;
    ppuVar7 = result + 1;
    lVar21 = 0;
    n1 = n1 - 1;
    if (n1 != 0) {
      from1 = from1 + 1;
      lVar19 = *lcp_input1;
      lcp_input1 = lcp_input1 + 1;
      uVar17 = (ulong)cache_input1[1];
      local_80 = cache_input1 + 2;
      sVar14 = n0;
      goto LAB_0024375d;
    }
    n1 = 0;
LAB_00243f5b:
    if (n0 == 0) {
      __assert_fail("n0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x527,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                   );
    }
    local_78 = from0;
    if (n1 != 0) {
      __assert_fail("n1==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x528,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                   );
    }
    goto LAB_00243fb3;
  }
  if (c == 0) {
    puVar12 = *from0;
    if (puVar12 == (uchar *)0x0) goto LAB_00244056;
    if (*from1 == (uchar *)0x0) goto LAB_00244075;
    iVar2 = strcmp((char *)puVar12,(char *)*from1);
    if (iVar2 != 0) {
      __assert_fail("cmp(*from0, *from1) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x470,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                   );
    }
    *result = puVar12;
    ppuVar7 = result + 1;
    lVar19 = 0;
    sVar14 = n0 - 1;
    if (sVar14 != 0) {
      from0 = from0 + 1;
      lVar21 = *lcp_input0;
      lcp_input0 = lcp_input0 + 1;
      c = cache_input0[1];
      local_90 = cache_input0 + 2;
      uVar17 = 0;
      goto LAB_0024375d;
    }
LAB_00243f81:
    sVar14 = 0;
    goto LAB_00243f8f;
  }
  tVar13 = compare((uchar *)&local_70,*from0,(size_t)*from1);
  lVar21 = tVar13.super__Tuple_impl<0UL,_int,_unsigned_long>._8_8_;
  lVar19 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
  if ((int)local_70._M_string_length < 0) {
    *result = *from0;
    puVar12 = *from1;
    if (puVar12 == (uchar *)0x0) {
LAB_002441ca:
      __assert_fail("ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                    ,0x26,"unsigned char get_char(unsigned char *, size_t)");
    }
    uVar10 = cache_input0[1];
    lVar20 = *lcp_input0;
    uVar18 = CONCAT71((int7)((ulong)puVar12 >> 8),puVar12[lVar19]);
    lVar21 = lVar20;
joined_r0x002436a7:
    n0 = n0 - 1;
    local_90 = cache_input0 + 2;
    lVar6 = lVar19;
    ppuVar9 = from0 + 1;
    plVar16 = lcp_input0 + 1;
    if (n0 == 0) {
      n0 = 0;
      local_90 = cache_input0 + 2;
      uVar3 = 2;
      from0 = from0 + 1;
      lcp_input0 = lcp_input0 + 1;
      lVar19 = lVar20;
      goto LAB_00243748;
    }
  }
  else {
    if ((int)local_70._M_string_length == 0) {
      *result = *from0;
      lVar20 = *lcp_input0;
      uVar10 = cache_input0[1];
      uVar18 = 0;
      goto joined_r0x002436a7;
    }
    *result = *from1;
    puVar12 = *from0;
    if (puVar12 == (uchar *)0x0) goto LAB_002441ca;
    lVar6 = *lcp_input1;
    lcp_input1 = lcp_input1 + 1;
    uVar10 = puVar12[lVar19];
    uVar18 = CONCAT71((int7)((ulong)puVar12 >> 8),cache_input1[1]);
    local_80 = cache_input1 + 2;
    n1 = n1 - 1;
    lVar21 = lVar19;
    ppuVar9 = from0;
    plVar16 = lcp_input0;
    lVar20 = lVar19;
    if (n1 == 0) {
      n1 = 0;
      uVar3 = 3;
      goto LAB_00243748;
    }
  }
  uVar3 = 0;
  from0 = ppuVar9;
  lcp_input0 = plVar16;
  lVar19 = lVar20;
LAB_00243748:
  (*(code *)((long)&DAT_00268ff0 + (long)(int)(&DAT_00268ff0)[uVar3]))
            (uVar10,from0,lVar21,&DAT_00268ff0,local_90,local_80,n0,ppuVar7,lcp_input0,uVar18,lVar6,
             lVar19,n1,lcp_input1);
  return;
LAB_00243d1f:
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tcache0 == cache1\n",0x13);
  local_78 = (uchar **)((long)ppuVar9 + lVar11);
  lcp_input1 = (lcp_t *)((long)plVar16 + lVar11);
  if (c == 0) {
    puVar12 = *ppuVar15;
    if (puVar12 == (uchar *)0x0) goto LAB_00244056;
    if (*local_78 == (uchar *)0x0) goto LAB_00244075;
    iVar2 = strcmp((char *)puVar12,(char *)*local_78);
    if (iVar2 != 0) {
      __assert_fail("cmp(*from0, *from1) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x4e7,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                   );
    }
    from0 = ppuVar15 + 1;
    *ppuVar7 = puVar12;
    ppuVar7 = ppuVar7 + 1;
    lVar21 = *lcp_input0;
    lcp_input0 = lcp_input0 + 1;
    c = *local_90;
    local_90 = local_90 + 1;
    sVar14 = sVar14 - 1;
    from1 = local_78;
    if (sVar14 == 0) {
      local_78 = (uchar **)((long)ppuVar9 + lVar11);
      sVar14 = 0;
      goto LAB_00243f8f;
    }
    goto LAB_00243774;
  }
  from0 = ppuVar15;
  compare((uchar *)&local_70,*ppuVar15,(size_t)*local_78);
  lVar21 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
  if ((int)local_70._M_string_length < 0) {
    *ppuVar7 = *ppuVar15;
    if (*local_78 == (uchar *)0x0) goto LAB_002441ca;
    c = *local_90;
    lVar20 = *lcp_input0;
    uVar17 = (ulong)(*local_78)[lVar21];
    from0 = ppuVar15;
joined_r0x00243ebc:
    sVar14 = sVar14 - 1;
    from0 = from0 + 1;
    lVar19 = lVar21;
    plVar16 = lcp_input0 + 1;
    pbVar1 = local_90 + 1;
    if (sVar14 == 0) {
      local_90 = local_90 + 1;
      iVar2 = 2;
      sVar14 = 0;
      lcp_input0 = lcp_input0 + 1;
      lVar21 = lVar20;
      goto LAB_00243f23;
    }
  }
  else {
    if ((int)local_70._M_string_length == 0) {
      *ppuVar7 = *from0;
      lVar20 = *lcp_input0;
      c = *local_90;
      uVar17 = 0;
      goto joined_r0x00243ebc;
    }
    *ppuVar7 = *local_78;
    if (*from0 == (uchar *)0x0) goto LAB_002441ca;
    lcp_input1 = (lcp_t *)((long)plVar16 + lVar11) + 1;
    lVar19 = *(lcp_t *)((long)plVar16 + lVar11);
    local_78 = (uchar **)((long)ppuVar9 + lVar11 + 8);
    c = (*from0)[lVar21];
    uVar17 = (ulong)*local_80;
    local_80 = local_80 + 1;
    n1 = n1 - 1;
    plVar16 = lcp_input0;
    lVar20 = lVar21;
    pbVar1 = local_90;
    if (n1 == 0) {
      iVar2 = 3;
      n1 = 0;
      goto LAB_00243f23;
    }
  }
  local_90 = pbVar1;
  iVar2 = 0;
  lcp_input0 = plVar16;
  lVar21 = lVar20;
LAB_00243f23:
  ppuVar7 = ppuVar7 + 1;
  from1 = local_78;
  if (iVar2 != 0) {
    if (iVar2 == 1) {
      return;
    }
    n0 = sVar14;
    if (iVar2 == 3) goto LAB_00243f5b;
    goto LAB_00243f8f;
  }
  goto LAB_00243774;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}